

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O2

bool __thiscall xray_re::_vector3<float>::similar(_vector3<float> *this,_vector3<float> *v,float e)

{
  if ((ABS((v->field_0).field_0.x - (this->field_0).field_0.x) < e) &&
     (ABS((v->field_0).field_0.y - (this->field_0).field_0.y) < e)) {
    return ABS((v->field_0).field_0.z - (this->field_0).field_0.z) < e;
  }
  return false;
}

Assistant:

bool _vector3<T>::similar(const _vector3<T>& v, T e) const
{
	if (e <= std::abs(v.x - x))
		return false;
	if (e <= std::abs(v.y - y))
		return false;
	if (e <= std::abs(v.z - z))
		return false;
	return true;
}